

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

tmbstr GetAllowedValuesFromPick(TidyOption topt)

{
  bool bVar1;
  ctmbstr ptVar2;
  size_t sVar3;
  char *__dest;
  tmbstr val;
  uint len;
  ctmbstr def;
  TidyIterator p_Stack_18;
  Bool first;
  TidyIterator pos;
  TidyOption topt_local;
  
  val._4_4_ = 0;
  pos = (TidyIterator)topt;
  p_Stack_18 = tidyOptGetPickList(topt);
  bVar1 = true;
  while (p_Stack_18 != (TidyIterator)0x0) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      val._4_4_ = val._4_4_ + 2;
    }
    ptVar2 = tidyOptGetNextPick((TidyOption)pos,&stack0xffffffffffffffe8);
    sVar3 = strlen(ptVar2);
    val._4_4_ = val._4_4_ + (int)sVar3;
  }
  __dest = (char *)malloc((ulong)(val._4_4_ + 1));
  if (__dest == (char *)0x0) {
    outOfMemory();
  }
  *__dest = '\0';
  p_Stack_18 = tidyOptGetPickList((TidyOption)pos);
  bVar1 = true;
  while (p_Stack_18 != (TidyIterator)0x0) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      strcat(__dest,", ");
    }
    ptVar2 = tidyOptGetNextPick((TidyOption)pos,&stack0xffffffffffffffe8);
    strcat(__dest,ptVar2);
  }
  return __dest;
}

Assistant:

static tmbstr GetAllowedValuesFromPick( TidyOption topt )
{
    TidyIterator pos;
    Bool first;
    ctmbstr def;
    uint len = 0;
    tmbstr val;

    pos = tidyOptGetPickList( topt );
    first = yes;
    while ( pos )
    {
        if (first)
            first = no;
        else
            len += 2;
        def = tidyOptGetNextPick( topt, &pos );
        len += strlen(def);
    }
    val = (tmbstr)malloc(len+1);
    if (!val) outOfMemory();
    val[0] = '\0';
    pos = tidyOptGetPickList( topt );
    first = yes;
    while ( pos )
    {
        if (first)
            first = no;
        else
            strcat(val, ", ");
        def = tidyOptGetNextPick( topt, &pos );
        strcat(val, def);
    }
    return val;
}